

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

path_t * __thiscall CField::get_solution_abi_cxx11_(path_t *__return_storage_ptr__,CField *this)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<std::pair<std::pair<int,_int>,_CField::SState>_>,_bool> pVar2;
  bool local_d1;
  allocator<char> local_a1;
  value_type local_a0;
  undefined1 local_79;
  _Rb_tree_const_iterator<std::pair<std::pair<int,_int>,_CField::SState>_> _Stack_78;
  bool should_clear;
  undefined1 local_70;
  pair<std::pair<int,_int>,_CField::SState> local_68;
  pair<std::pair<int,_int>,_CField::SState> local_58;
  _Self local_48;
  _Self local_40 [3];
  SState local_24;
  SState s;
  CField *this_local;
  path_t *result;
  
  s.direction._3_1_ = EP_SOUTH >> 0x18;
  unique0x10000236 = this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  SState::SState(&local_24,EP_SOUTH,false,false);
  while( true ) {
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         set<std::pair<std::pair<int,_int>,_CField::SState>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
         ::end(&this->passed);
    std::pair<std::pair<int,_int>,_CField::SState>::
    pair<std::pair<int,_int>_&,_CField::SState_&,_true>(&local_58,&this->bender,&local_24);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::pair<std::pair<int,_int>,_CField::SState>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
         ::find(&this->passed,&local_58);
    bVar1 = std::operator==(local_40,&local_48);
    local_d1 = false;
    if (bVar1) {
      local_d1 = std::operator!=(&this->_exit,&this->bender);
    }
    if (local_d1 == false) break;
    std::pair<std::pair<int,_int>,_CField::SState>::
    pair<std::pair<int,_int>_&,_CField::SState_&,_true>(&local_68,&this->bender,&local_24);
    pVar2 = std::
            set<std::pair<std::pair<int,_int>,_CField::SState>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
            ::insert(&this->passed,&local_68);
    _Stack_78 = pVar2.first._M_node;
    local_70 = pVar2.second;
    local_79 = step(this,&this->bender,&local_24,__return_storage_ptr__);
    if ((bool)local_79) {
      std::
      set<std::pair<std::pair<int,_int>,_CField::SState>,_std::less<std::pair<std::pair<int,_int>,_CField::SState>_>,_std::allocator<std::pair<std::pair<int,_int>,_CField::SState>_>_>
      ::clear(&this->passed);
    }
  }
  bVar1 = std::operator!=(&this->_exit,&this->bender);
  if (bVar1) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"LOOP",&local_a1);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return __return_storage_ptr__;
}

Assistant:

path_t get_solution()
        {
            //dump_field();
            path_t result;
            SState s(EP_SOUTH, false, false);
            while (passed.end() == passed.find(cell_state_t(bender, s))
                && _exit != bender)
            {
                passed.insert(cell_state_t(bender, s));
                bool should_clear = step(bender, s, result);
                if (should_clear)
                {
                    passed.clear();
                }
            }
            if (_exit != bender)
            {
                result.clear();
                result.push_back("LOOP");
            }
            
            return result;
        }